

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<DataStream,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *v)

{
  pointer pPVar1;
  value_type *elem;
  pointer pPVar2;
  long in_FS_OFFSET;
  ParamsStream<DataStream_&,_TransactionSerParams> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (s,((long)(v->
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(v->
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pPVar2 = (v->super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (v->super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    do {
      WriteCompactSize<DataStream>(s,(ulong)pPVar2->index);
      local_40.m_params = &::TX_WITH_WITNESS;
      local_40.m_substream = s;
      SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
                ((pPVar2->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_40,&::TX_WITH_WITNESS);
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }